

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

int __thiscall FPathTraverse::init(FPathTraverse *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  double dVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  int extraout_EAX;
  uint uVar6;
  int iVar7;
  double in_XMM0_Qa;
  double dVar8;
  double in_XMM1_Qa;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  double dVar13;
  double in_XMM4_Qa;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  int iVar20;
  int iVar21;
  FBlockThingsIterator btit;
  double local_1f8;
  double local_1d8;
  undefined1 local_188 [16];
  undefined8 local_170;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_48;
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry> local_40;
  
  (this->trace).x = in_XMM0_Qa;
  (this->trace).y = in_XMM1_Qa;
  uVar4 = (uint)ctx & 8;
  dVar10 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  uVar6 = (uint)(((ulong)ctx & 8) == 0);
  auVar12._0_8_ = CONCAT44((int)(uVar6 << 0x1f) >> 0x1f,(int)(uVar6 << 0x1f) >> 0x1f);
  auVar12._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar12._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  dVar9 = (double)(~auVar12._0_8_ & CONCAT44(in_XMM2_Db,in_XMM2_Da) |
                  (ulong)(dVar10 - in_XMM0_Qa) & auVar12._0_8_);
  dVar8 = (double)(~auVar12._8_8_ & (ulong)in_XMM3_Qa |
                  (ulong)(in_XMM3_Qa - in_XMM1_Qa) & auVar12._8_8_);
  (this->trace).dx = dVar9;
  (this->trace).dy = dVar8;
  if (0.0 < in_XMM4_Qa) {
    in_XMM0_Qa = in_XMM0_Qa + in_XMM4_Qa * dVar9;
    in_XMM1_Qa = in_XMM1_Qa + in_XMM4_Qa * dVar8;
    dVar10 = dVar9 - in_XMM4_Qa * dVar9;
    in_XMM3_Qa = dVar8 - in_XMM4_Qa * dVar8;
    ctx = (EVP_PKEY_CTX *)((ulong)ctx & 0xffffffff);
    uVar4 = 8;
  }
  validcount = validcount + 1;
  this->intercept_index = intercepts.Count;
  this->Startfrac = in_XMM4_Qa;
  uVar4 = (uint)(uVar4 == 0);
  dVar14 = in_XMM0_Qa - bmaporgx;
  dVar8 = in_XMM1_Qa - bmaporgy;
  dVar13 = dVar14 * 0.0078125;
  dVar11 = dVar8 * 0.0078125;
  dVar15 = dVar13 + -0.499999985 + 6755399441055744.0;
  auVar16._0_8_ = CONCAT44((int)(uVar4 << 0x1f) >> 0x1f,(int)(uVar4 << 0x1f) >> 0x1f);
  auVar16._8_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
  auVar16._12_4_ = (int)(uVar4 << 0x1f) >> 0x1f;
  uVar3 = (ulong)in_XMM3_Qa & auVar16._8_8_;
  auVar17._0_8_ = ~auVar16._0_8_ & (ulong)(dVar10 + in_XMM0_Qa);
  auVar17._8_8_ = ~auVar16._8_8_ & (ulong)(in_XMM3_Qa + in_XMM1_Qa);
  dVar9 = dVar11 + -0.499999985 + 6755399441055744.0;
  auVar1._8_4_ = (int)uVar3;
  auVar1._0_8_ = (ulong)dVar10 & auVar16._0_8_;
  auVar1._12_4_ = (int)(uVar3 >> 0x20);
  dVar10 = SUB168(auVar17 | auVar1,0) - bmaporgx;
  dVar18 = SUB168(auVar17 | auVar1,8) - bmaporgy;
  iVar20 = SUB84(dVar10 * 0.0078125 + -0.499999985 + 6755399441055744.0,0);
  iVar21 = SUB84(dVar18 * 0.0078125 + -0.499999985 + 6755399441055744.0,0);
  uVar3 = (ulong)dVar9 & 0xffffffff;
  iVar5 = SUB84(dVar15,0);
  if (iVar5 < iVar20) {
    dVar2 = (double)iVar5 + (1.0 - dVar13);
    dVar19 = (dVar18 - dVar8) / ABS(dVar10 - dVar14);
    iVar20 = 1;
  }
  else if (iVar20 < iVar5) {
    dVar2 = dVar13 - (double)iVar5;
    dVar19 = (dVar18 - dVar8) / ABS(dVar10 - dVar14);
    iVar20 = -1;
  }
  else {
    dVar19 = 256.0;
    iVar20 = 0;
    dVar2 = 1.0;
  }
  iVar7 = SUB84(dVar9,0);
  if (iVar7 < iVar21) {
    dVar9 = (double)iVar7 + (1.0 - dVar11);
    dVar10 = (dVar10 - dVar14) / ABS(dVar18 - dVar8);
    iVar21 = 1;
  }
  else if (iVar21 < iVar7) {
    dVar9 = dVar11 - (double)iVar7;
    dVar10 = (dVar10 - dVar14) / ABS(dVar18 - dVar8);
    iVar21 = -1;
  }
  else {
    dVar10 = 256.0;
    iVar21 = 0;
    dVar9 = 1.0;
  }
  local_1f8 = dVar2 * dVar19 + dVar11;
  local_1d8 = dVar9 * dVar10 + dVar13;
  if ((((ABS(dVar10) == 1.0) && (!NAN(ABS(dVar10)))) && (ABS(dVar19) == 1.0)) &&
     (((!NAN(ABS(dVar19)) &&
       (dVar8 = (double)(~-(ulong)(dVar19 < 0.0) & (ulong)dVar2 |
                        (ulong)(1.0 - dVar2) & -(ulong)(dVar19 < 0.0)),
       dVar10 = (double)(~-(ulong)(dVar10 < 0.0) & (ulong)dVar9 |
                        (ulong)(1.0 - dVar9) & -(ulong)(dVar10 < 0.0)), dVar8 == dVar10)) &&
      (!NAN(dVar8) && !NAN(dVar10))))) {
    local_1d8 = dVar13;
    local_1f8 = dVar11;
  }
  uVar4 = (uint)i_compatflags >> 0x1c;
  local_40.Most = 0;
  local_40.Count = 0;
  local_40.Array =
       (HashEntry *)
       M_Malloc_Dbg(0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                    ,0x8c);
  local_188 = (undefined1  [16])0x0;
  local_168 = 0xffffffff;
  uStack_164 = 0xffffffff;
  uStack_160 = 0xffffffff;
  uStack_15c = 0xffffffff;
  local_158 = 0xffffffff;
  uStack_154 = 0xffffffff;
  uStack_150 = 0xffffffff;
  uStack_14c = 0xffffffff;
  local_148 = 0xffffffff;
  uStack_144 = 0xffffffff;
  uStack_140 = 0xffffffff;
  uStack_13c = 0xffffffff;
  local_138 = 0xffffffff;
  uStack_134 = 0xffffffff;
  uStack_130 = 0xffffffff;
  uStack_12c = 0xffffffff;
  local_128 = 0xffffffff;
  uStack_124 = 0xffffffff;
  uStack_120 = 0xffffffff;
  uStack_11c = 0xffffffff;
  local_118 = 0xffffffff;
  uStack_114 = 0xffffffff;
  uStack_110 = 0xffffffff;
  uStack_10c = 0xffffffff;
  local_108 = 0xffffffff;
  uStack_104 = 0xffffffff;
  uStack_100 = 0xffffffff;
  uStack_fc = 0xffffffff;
  local_f8 = 0xffffffff;
  uStack_f4 = 0xffffffff;
  uStack_f0 = 0xffffffff;
  uStack_ec = 0xffffffff;
  local_48 = 0;
  local_170 = 0;
  if (((ulong)ctx & 1) != 0) {
    (**this->_vptr_FPathTraverse)(this,(ulong)dVar15 & 0xffffffff,uVar3);
  }
  if (((ulong)ctx & 2) != 0) {
    (*this->_vptr_FPathTraverse[1])
              (this,(ulong)dVar15 & 0xffffffff,uVar3,local_188,
               (ulong)(uVar4 & (uint)((ulong)ctx >> 2) & 0x3fffffff & 1));
  }
  if (iVar21 != 0 || iVar20 != 0) {
    iVar5 = (*(code *)(&DAT_006014b8 +
                      *(int *)(&DAT_006014b8 +
                              (ulong)((uint)(iVar5 == SUB84(local_1d8 + -0.499999985 +
                                                            6755399441055744.0,0)) +
                                     (uint)(iVar7 == SUB84(local_1f8 + -0.499999985 +
                                                           6755399441055744.0,0)) * 2) * 4)))();
    return iVar5;
  }
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray(&local_40);
  return extraout_EAX;
}

Assistant:

void FPathTraverse::init(double x1, double y1, double x2, double y2, int flags, double startfrac) 
{
	double xt1, yt1, xt2, yt2;
	double xstep, ystep;
	double partialx, partialy;
	double xintercept, yintercept;
	
	int 		mapx;
	int 		mapy;
	
	int 		mapxstep;
	int 		mapystep;

	int 		count;

	trace.x = x1;
	trace.y = y1;
	if (flags & PT_DELTA)
	{
		trace.dx = x2;
		trace.dy = y2;
	}
	else
	{
		trace.dx = x2 - x1;
		trace.dy = y2 - y1;
	}
	if (startfrac > 0)
	{
		double startdx = trace.dx * startfrac;
		double startdy = trace.dy * startfrac;

		x1 += startdx;
		y1 += startdy;
		x2 = trace.dx - startdx;
		y2 = trace.dy - startdy;
		flags |= PT_DELTA;
	}

	validcount++;
	intercept_index = intercepts.Size();
	Startfrac = startfrac;

	if (flags & PT_DELTA)
	{
		x2 += x1;
		y2 += y1;
	}

	x1 -= bmaporgx;
	y1 -= bmaporgy;
	xt1 = x1 / MAPBLOCKUNITS;
	yt1 = y1 / MAPBLOCKUNITS;

	x2 -= bmaporgx;
	y2 -= bmaporgy;
	xt2 = x2 / MAPBLOCKUNITS;
	yt2 = y2 / MAPBLOCKUNITS;

	mapx = xs_FloorToInt(xt1);
	mapy = xs_FloorToInt(yt1);
	int mapex = xs_FloorToInt(xt2);
	int mapey = xs_FloorToInt(yt2);


	if (mapex > mapx)
	{
		mapxstep = 1;
		partialx = 1. - xt1 + xs_FloorToInt(xt1);
		ystep = (y2 - y1) / fabs(x2 - x1);
	}
	else if (mapex < mapx)
	{
		mapxstep = -1;
		partialx = xt1 - xs_FloorToInt(xt1);
		ystep = (y2 - y1) / fabs(x2 - x1);
	}
	else
	{
		mapxstep = 0;
		partialx = 1.;
		ystep = 256;
	}
	yintercept = yt1 + partialx * ystep;

	if (mapey > mapy)
	{
		mapystep = 1;
		partialy = 1. - yt1 + xs_FloorToInt(yt1);
		xstep = (x2 - x1) / fabs(y2 - y1);
	}
	else if (mapey < mapy)
	{
		mapystep = -1;
		partialy = yt1 - xs_FloorToInt(yt1);
		xstep = (x2 - x1) / fabs(y2 - y1);
	}
	else
	{
		mapystep = 0;
		partialy = 1;
		xstep = 256;
	}
	xintercept = xt1 + partialy * xstep;

	// [RH] Fix for traces that pass only through blockmap corners. In that case,
	// xintercept and yintercept can both be set ahead of mapx and mapy, so the
	// for loop would never advance anywhere.

	if (fabs(xstep) == 1. && fabs(ystep) == 1.)
	{
		if (ystep < 0)
		{
			partialx = 1. - partialx;
		}
		if (xstep < 0)
		{
			partialy = 1. - partialy;
		}
		if (partialx == partialy)
		{
			xintercept = xt1;
			yintercept = yt1;
		}
	}

	// Step through map blocks.
	// Count is present to prevent a round off error
	// from skipping the break statement.

	bool compatible = (flags & PT_COMPATIBLE) && (i_compatflags & COMPATF_HITSCAN);
		
	// we want to use one list of checked actors for the entire operation
	FBlockThingsIterator btit;
	for (count = 0 ; count < 1000 ; count++)
	{
		if (flags & PT_ADDLINES)
		{
			AddLineIntercepts(mapx, mapy);
		}
		
		if (flags & PT_ADDTHINGS)
		{
			AddThingIntercepts(mapx, mapy, btit, compatible);
		}
				
		// both coordinates reached the end, so end the traversing.
		if ((mapxstep | mapystep) == 0)
			break;


		// [RH] Handle corner cases properly instead of pretending they don't exist.
		switch (((xs_FloorToInt(yintercept) == mapy) << 1) | (xs_FloorToInt(xintercept) == mapx))
		{
		case 0:		// neither xintercept nor yintercept match!
			count = 1000;	// Stop traversing, because somebody screwed up.
			break;

		case 1:		// xintercept matches
			xintercept += xstep;
			mapy += mapystep;
			if (mapy == mapey)
				mapystep = 0;
			break;

		case 2:		// yintercept matches
			yintercept += ystep;
			mapx += mapxstep;
			if (mapx == mapex)
				mapxstep = 0;
			break;

		case 3:		// xintercept and yintercept both match
			// The trace is exiting a block through its corner. Not only does the block
			// being entered need to be checked (which will happen when this loop
			// continues), but the other two blocks adjacent to the corner also need to
			// be checked.
			// Since Doom.exe did not do this, this code won't either if run in compatibility mode.
			if (!compatible)
			{
				if (flags & PT_ADDLINES)
				{
					AddLineIntercepts(mapx + mapxstep, mapy);
					AddLineIntercepts(mapx, mapy + mapystep);
				}
				
				if (flags & PT_ADDTHINGS)
				{
					AddThingIntercepts(mapx + mapxstep, mapy, btit, false);
					AddThingIntercepts(mapx, mapy + mapystep, btit, false);
				}
				xintercept += xstep;
				yintercept += ystep;
				mapx += mapxstep;
				mapy += mapystep;
				if (mapx == mapex)
					mapxstep = 0;
				if (mapy == mapey)
					mapystep = 0;
			}
			else
			{
				count = 1000; //	Doom originally did not handle this case so do the same in compatibility mode.
			}
			break;
		}
	}
}